

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall cmExtraSublimeTextGenerator::Generate(cmExtraSublimeTextGenerator *this)

{
  bool bVar1;
  cmGlobalGenerator *pcVar2;
  _Base_ptr p_Var3;
  allocator local_31;
  string local_30;
  
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string
            ((string *)&local_30,"CMAKE_SUBLIME_TEXT_2_EXCLUDE_BUILD_TREE",&local_31);
  bVar1 = cmGlobalGenerator::GlobalSettingIsOn(pcVar2,&local_30);
  this->ExcludeBuildFolder = bVar1;
  std::__cxx11::string::~string((string *)&local_30);
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string((string *)&local_30,"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS",&local_31);
  cmGlobalGenerator::GetSafeGlobalSetting(pcVar2,&local_30);
  std::__cxx11::string::assign((char *)&this->EnvSettings);
  std::__cxx11::string::~string((string *)&local_30);
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var3 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           (p_Var3 + 2));
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::Generate()
{
  this->ExcludeBuildFolder = this->GlobalGenerator->GlobalSettingIsOn(
    "CMAKE_SUBLIME_TEXT_2_EXCLUDE_BUILD_TREE");
  this->EnvSettings = this->GlobalGenerator->GetSafeGlobalSetting(
    "CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS");

  // for each sub project in the project create a sublime text 2 project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
         it = this->GlobalGenerator->GetProjectMap().begin();
       it != this->GlobalGenerator->GetProjectMap().end(); ++it) {
    // create a project file
    this->CreateProjectFile(it->second);
  }
}